

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_module(lysp_yang_ctx *ctx,lysp_module *mod)

{
  LY_ERR LVar1;
  char *pcVar2;
  char *pcVar3;
  lysp_submodule *plVar4;
  ly_ctx *local_1c0;
  ly_ctx *local_1b8;
  ly_ctx *local_1b0;
  ly_ctx *local_1a8;
  ly_ctx *local_198;
  ly_ctx *local_190;
  ly_ctx *local_170;
  ly_ctx *local_158;
  ly_ctx *local_140;
  ly_ctx *local_128;
  ly_ctx *local_110;
  ly_ctx *local_f8;
  char *local_f0;
  ly_ctx *local_e0;
  ly_ctx *local_d8;
  LY_ERR ret___27;
  LY_ERR ret___26;
  LY_ERR ret___25;
  LY_ERR ret___24;
  LY_ERR ret___23;
  LY_ERR ret___22;
  LY_ERR ret___21;
  LY_ERR ret___20;
  LY_ERR ret___19;
  LY_ERR ret___18;
  LY_ERR ret___17;
  LY_ERR ret___16;
  LY_ERR ret___15;
  LY_ERR ret___14;
  LY_ERR ret___13;
  LY_ERR ret___12;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_bool __loop_end;
  LY_ERR ret__;
  lysp_submodule *dup;
  yang_module_stmt local_48;
  yang_module_stmt mod_stmt;
  ly_stmt prev_kw;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_module *plStack_20;
  LY_ERR ret;
  lysp_module *mod_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  local_48 = Y_MOD_MODULE_HEADER;
  dup._4_4_ = 0;
  mod->field_0x79 = mod->field_0x79 & 0xfd;
  plStack_20 = mod;
  mod_local = (lysp_module *)ctx;
  LVar1 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,(char **)&word_len,&word,(size_t *)&prev_kw
                      );
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if (word == (char *)0x0) {
    if (mod_local == (lysp_module *)0x0) {
      local_e0 = (ly_ctx *)0x0;
    }
    else {
      local_e0 = *(ly_ctx **)
                  **(undefined8 **)
                    (mod_local->typedefs->units +
                    (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
    }
    if (_prev_kw == 0) {
      local_f0 = "";
    }
    else {
      local_f0 = (char *)word_len;
    }
    buf._4_4_ = lydict_insert(local_e0,local_f0,_prev_kw,&plStack_20->mod->name);
  }
  else {
    if (mod_local == (lysp_module *)0x0) {
      local_d8 = (ly_ctx *)0x0;
    }
    else {
      local_d8 = *(ly_ctx **)
                  **(undefined8 **)
                    (mod_local->typedefs->units +
                    (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
    }
    buf._4_4_ = lydict_insert_zc(local_d8,(char *)word_len,&plStack_20->mod->name);
  }
  if (buf._4_4_ == LY_SUCCESS) {
    buf._4_4_ = 0;
    buf._4_4_ = get_keyword((lysp_yang_ctx *)mod_local,&mod_stmt,(char **)&word_len,
                            (size_t *)&prev_kw);
    if (buf._4_4_ == LY_SUCCESS) {
      if (mod_stmt == 0x350001) {
        ret___2._3_1_ = 1;
        LVar1 = buf._4_4_;
      }
      else {
        if (mod_stmt != 0x350002) {
          if (mod_local == (lysp_module *)0x0) {
            local_f8 = (ly_ctx *)0x0;
          }
          else {
            local_f8 = *(ly_ctx **)
                        **(undefined8 **)
                          (mod_local->typedefs->units +
                          (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
          }
          pcVar3 = lyplg_ext_stmt2str(mod_stmt);
          ly_vlog(local_f8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar3);
          return LY_EVALID;
        }
        LVar1 = get_keyword((lysp_yang_ctx *)mod_local,&mod_stmt,(char **)&word_len,
                            (size_t *)&prev_kw);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        ret___2._3_1_ = mod_stmt == 0x350003;
        LVar1 = LY_SUCCESS;
      }
      while (buf._4_4_ = LVar1, !(bool)ret___2._3_1_) {
        if (((((((mod_stmt == Y_MOD_LINKAGE) || (mod_stmt == 0x10)) || (mod_stmt == 0x20)) ||
              ((mod_stmt == 0x40 || (mod_stmt == 0x80)))) ||
             ((mod_stmt == 0x200 || ((mod_stmt == 0x400 || (mod_stmt == 0x800)))))) ||
            (mod_stmt == 0x1000)) ||
           (((mod_stmt == 0x2000 || (mod_stmt == 0x4000)) || (mod_stmt == 0x8000)))) {
LAB_001cd477:
          dup._4_4_ = 4;
        }
        else {
          if ((mod_stmt == 0x60000) || (mod_stmt == 0x80000)) goto LAB_001cd31a;
          if ((mod_stmt == 0xa0000) || (mod_stmt == 0xe0000)) goto LAB_001cd477;
          if (mod_stmt != 0xf0000) {
            if ((mod_stmt == 0x100000) || (mod_stmt == 0x120000)) goto LAB_001cd477;
            if ((mod_stmt == 0x140000) || (mod_stmt == 0x150000)) {
              if (1 < dup._4_4_) {
                if (mod_local == (lysp_module *)0x0) {
                  local_140 = (ly_ctx *)0x0;
                }
                else {
                  local_140 = *(ly_ctx **)
                               **(undefined8 **)
                                 (mod_local->typedefs->units +
                                 (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
                }
                pcVar3 = lyplg_ext_stmt2str(mod_stmt);
                pcVar2 = lyplg_ext_stmt2str(local_48);
                ly_vlog(local_140,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\", it cannot appear after \"%s\".",pcVar3,pcVar2);
                return LY_EVALID;
              }
              dup._4_4_ = 1;
            }
            else if (mod_stmt == 0x1e0000) {
LAB_001cd10a:
              if (dup._4_4_ != 0) {
                if (mod_local == (lysp_module *)0x0) {
                  local_110 = (ly_ctx *)0x0;
                }
                else {
                  local_110 = *(ly_ctx **)
                               **(undefined8 **)
                                 (mod_local->typedefs->units +
                                 (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
                }
                pcVar3 = lyplg_ext_stmt2str(mod_stmt);
                pcVar2 = lyplg_ext_stmt2str(local_48);
                ly_vlog(local_110,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\", it cannot appear after \"%s\".",pcVar3,pcVar2);
                return LY_EVALID;
              }
              dup._4_4_ = 0;
            }
            else {
              if (mod_stmt != 0x200000) {
                if (mod_stmt == 0x240000) goto LAB_001cd10a;
                if (mod_stmt != 0x270000) {
                  if (mod_stmt == 0x2a0000) {
                    if (3 < dup._4_4_) {
                      if (mod_local == (lysp_module *)0x0) {
                        local_170 = (ly_ctx *)0x0;
                      }
                      else {
                        local_170 = *(ly_ctx **)
                                     **(undefined8 **)
                                       (mod_local->typedefs->units +
                                       (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) *
                                       8);
                      }
                      pcVar3 = lyplg_ext_stmt2str(LY_STMT_REVISION);
                      pcVar2 = lyplg_ext_stmt2str(local_48);
                      ly_vlog(local_170,(char *)0x0,LYVE_SYNTAX_YANG,
                              "Invalid keyword \"%s\", it cannot appear after \"%s\".",pcVar3,pcVar2
                             );
                      return LY_EVALID;
                    }
                    dup._4_4_ = 3;
                  }
                  else {
                    if (mod_stmt == 0x2f0000) goto LAB_001cd477;
                    if (mod_stmt == 0x340000) {
                      if (dup._4_4_ != 0) {
                        if (mod_local == (lysp_module *)0x0) {
                          local_128 = (ly_ctx *)0x0;
                        }
                        else {
                          local_128 = *(ly_ctx **)
                                       **(undefined8 **)
                                         (mod_local->typedefs->units +
                                         (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1)
                                         * 8);
                        }
                        pcVar3 = lyplg_ext_stmt2str(LY_STMT_YANG_VERSION);
                        pcVar2 = lyplg_ext_stmt2str(local_48);
                        ly_vlog(local_128,(char *)0x0,LYVE_SYNTAX_YANG,
                                "Invalid keyword \"%s\", it cannot appear after \"%s\".",pcVar3,
                                pcVar2);
                        return LY_EVALID;
                      }
                      dup._4_4_ = 0;
                    }
                  }
                  goto LAB_001cd484;
                }
              }
LAB_001cd31a:
              if (2 < dup._4_4_) {
                if (mod_local == (lysp_module *)0x0) {
                  local_158 = (ly_ctx *)0x0;
                }
                else {
                  local_158 = *(ly_ctx **)
                               **(undefined8 **)
                                 (mod_local->typedefs->units +
                                 (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
                }
                pcVar3 = lyplg_ext_stmt2str(mod_stmt);
                pcVar2 = lyplg_ext_stmt2str(local_48);
                ly_vlog(local_158,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\", it cannot appear after \"%s\".",pcVar3,pcVar2);
                return LY_EVALID;
              }
              dup._4_4_ = 2;
            }
          }
        }
LAB_001cd484:
        local_48 = mod_stmt;
        if (mod_stmt == Y_MOD_LINKAGE) {
          LVar1 = parse_notif((lysp_yang_ctx *)mod_local,(lysp_node *)0x0,&plStack_20->notifs);
        }
        else if (mod_stmt == 0x10) {
          LVar1 = parse_action((lysp_yang_ctx *)mod_local,(lysp_node *)0x0,&plStack_20->rpcs);
        }
        else {
          if (mod_stmt == 0x20) {
            if (*(byte *)(*(long *)(mod_local->typedefs->units +
                                   (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8)
                         + 0x78) < 2) {
              if (mod_local == (lysp_module *)0x0) {
                local_190 = (ly_ctx *)0x0;
              }
              else {
                local_190 = *(ly_ctx **)
                             **(undefined8 **)
                               (mod_local->typedefs->units +
                               (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
              }
              ly_vlog(local_190,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                      ,"anydata","module");
              return LY_EVALID;
            }
          }
          else if (mod_stmt != 0x40) {
            if (mod_stmt == 0x80) {
              LVar1 = parse_augment((lysp_yang_ctx *)mod_local,(lysp_node *)0x0,
                                    &plStack_20->augments);
            }
            else if (mod_stmt == 0x200) {
              LVar1 = parse_choice((lysp_yang_ctx *)mod_local,(lysp_node *)0x0,&plStack_20->data);
            }
            else if (mod_stmt == 0x400) {
              LVar1 = parse_container((lysp_yang_ctx *)mod_local,(lysp_node *)0x0,&plStack_20->data)
              ;
            }
            else if (mod_stmt == 0x800) {
              LVar1 = parse_grouping((lysp_yang_ctx *)mod_local,(lysp_node *)0x0,
                                     &plStack_20->groupings);
            }
            else if (mod_stmt == 0x1000) {
              LVar1 = parse_leaf((lysp_yang_ctx *)mod_local,(lysp_node *)0x0,&plStack_20->data);
            }
            else if (mod_stmt == 0x2000) {
              LVar1 = parse_leaflist((lysp_yang_ctx *)mod_local,(lysp_node *)0x0,&plStack_20->data);
            }
            else if (mod_stmt == 0x4000) {
              LVar1 = parse_list((lysp_yang_ctx *)mod_local,(lysp_node *)0x0,&plStack_20->data);
            }
            else if (mod_stmt == 0x8000) {
              LVar1 = parse_uses((lysp_yang_ctx *)mod_local,(lysp_node *)0x0,&plStack_20->data);
            }
            else if (mod_stmt == 0x60000) {
              LVar1 = parse_text_field((lysp_yang_ctx *)mod_local,plStack_20,LY_STMT_CONTACT,0,
                                       &plStack_20->mod->contact,Y_STR_ARG,(uint16_t *)0x0,
                                       &plStack_20->exts);
            }
            else if (mod_stmt == 0x80000) {
              LVar1 = parse_text_field((lysp_yang_ctx *)mod_local,plStack_20->mod->dsc,
                                       LY_STMT_DESCRIPTION,0,&plStack_20->mod->dsc,Y_STR_ARG,
                                       (uint16_t *)0x0,&plStack_20->exts);
            }
            else if (mod_stmt == 0xa0000) {
              LVar1 = parse_deviation((lysp_yang_ctx *)mod_local,&plStack_20->deviations);
            }
            else if (mod_stmt == 0xe0000) {
              LVar1 = parse_extension((lysp_yang_ctx *)mod_local,&plStack_20->extensions);
            }
            else if (mod_stmt == 0xf0000) {
              LVar1 = parse_ext((lysp_yang_ctx *)mod_local,(char *)word_len,_prev_kw,plStack_20,
                                LY_STMT_MODULE,0,&plStack_20->exts);
            }
            else if (mod_stmt == 0x100000) {
              LVar1 = parse_feature((lysp_yang_ctx *)mod_local,&plStack_20->features);
            }
            else if (mod_stmt == 0x120000) {
              LVar1 = parse_identity((lysp_yang_ctx *)mod_local,&plStack_20->identities);
            }
            else if (mod_stmt == 0x140000) {
              LVar1 = parse_import((lysp_yang_ctx *)mod_local,plStack_20->mod->prefix,
                                   &plStack_20->imports);
            }
            else if (mod_stmt == 0x150000) {
              LVar1 = parse_include((lysp_yang_ctx *)mod_local,plStack_20->mod->name,
                                    &plStack_20->includes);
            }
            else if (mod_stmt == 0x1e0000) {
              LVar1 = parse_text_field((lysp_yang_ctx *)mod_local,plStack_20,LY_STMT_NAMESPACE,0,
                                       &plStack_20->mod->ns,Y_STR_ARG,(uint16_t *)0x0,
                                       &plStack_20->exts);
            }
            else if (mod_stmt == 0x200000) {
              LVar1 = parse_text_field((lysp_yang_ctx *)mod_local,plStack_20,LY_STMT_ORGANIZATION,0,
                                       &plStack_20->mod->org,Y_STR_ARG,(uint16_t *)0x0,
                                       &plStack_20->exts);
            }
            else if (mod_stmt == 0x240000) {
              LVar1 = parse_text_field((lysp_yang_ctx *)mod_local,plStack_20->mod->prefix,
                                       LY_STMT_PREFIX,0,&plStack_20->mod->prefix,Y_IDENTIF_ARG,
                                       (uint16_t *)0x0,&plStack_20->exts);
            }
            else if (mod_stmt == 0x270000) {
              LVar1 = parse_text_field((lysp_yang_ctx *)mod_local,plStack_20->mod->ref,
                                       LY_STMT_REFERENCE,0,&plStack_20->mod->ref,Y_STR_ARG,
                                       (uint16_t *)0x0,&plStack_20->exts);
            }
            else if (mod_stmt == 0x2a0000) {
              LVar1 = parse_revision((lysp_yang_ctx *)mod_local,&plStack_20->revs);
            }
            else if (mod_stmt == 0x2f0000) {
              LVar1 = parse_typedef((lysp_yang_ctx *)mod_local,(lysp_node *)0x0,
                                    &plStack_20->typedefs);
            }
            else {
              if (mod_stmt != 0x340000) {
                if (mod_local == (lysp_module *)0x0) {
                  local_198 = (ly_ctx *)0x0;
                }
                else {
                  local_198 = *(ly_ctx **)
                               **(undefined8 **)
                                 (mod_local->typedefs->units +
                                 (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
                }
                pcVar3 = lyplg_ext_stmt2str(mod_stmt);
                ly_vlog(local_198,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,"module");
                return LY_EVALID;
              }
              LVar1 = parse_yangversion((lysp_yang_ctx *)mod_local,plStack_20);
            }
            goto joined_r0x001cdced;
          }
          LVar1 = parse_any((lysp_yang_ctx *)mod_local,mod_stmt,(lysp_node *)0x0,&plStack_20->data);
        }
joined_r0x001cdced:
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        buf._4_4_ = get_keyword((lysp_yang_ctx *)mod_local,&mod_stmt,(char **)&word_len,
                                (size_t *)&prev_kw);
        if (buf._4_4_ != LY_SUCCESS) {
          return buf._4_4_;
        }
        LVar1 = LY_SUCCESS;
        if (mod_stmt == 0x350003) {
          if ((plStack_20->exts != (lysp_ext_instance *)0x0) &&
             (LVar1 = ly_set_add((ly_set *)((long)&mod_local->groupings->field_0 + 0x28),
                                 plStack_20->exts,'\x01',(uint32_t *)0x0), LVar1 != LY_SUCCESS)) {
            return LVar1;
          }
          buf._4_4_ = LVar1;
          ret___2._3_1_ = true;
          LVar1 = buf._4_4_;
        }
      }
      if (plStack_20->mod->ns == (char *)0x0) {
        if (mod_local == (lysp_module *)0x0) {
          local_1a8 = (ly_ctx *)0x0;
        }
        else {
          local_1a8 = *(ly_ctx **)
                       **(undefined8 **)
                         (mod_local->typedefs->units +
                         (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
        }
        ly_vlog(local_1a8,(char *)0x0,LYVE_SYNTAX_YANG,
                "Missing mandatory keyword \"%s\" as a child of \"%s\".","namespace","module");
        return LY_EVALID;
      }
      if (plStack_20->mod->prefix == (char *)0x0) {
        if (mod_local == (lysp_module *)0x0) {
          local_1b0 = (ly_ctx *)0x0;
        }
        else {
          local_1b0 = *(ly_ctx **)
                       **(undefined8 **)
                         (mod_local->typedefs->units +
                         (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
        }
        ly_vlog(local_1b0,(char *)0x0,LYVE_SYNTAX_YANG,
                "Missing mandatory keyword \"%s\" as a child of \"%s\".","prefix","module");
        return LY_EVALID;
      }
      if (mod_local == (lysp_module *)0x0) {
        local_1b8 = (ly_ctx *)0x0;
      }
      else {
        local_1b8 = *(ly_ctx **)
                     **(undefined8 **)
                       (mod_local->typedefs->units +
                       (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
      }
      plVar4 = ly_ctx_get_submodule_latest(local_1b8,plStack_20->mod->name);
      if (plVar4 != (lysp_submodule *)0x0) {
        if (mod_local == (lysp_module *)0x0) {
          local_1c0 = (ly_ctx *)0x0;
        }
        else {
          local_1c0 = *(ly_ctx **)
                       **(undefined8 **)
                         (mod_local->typedefs->units +
                         (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
        }
        ly_vlog(local_1c0,(char *)0x0,LYVE_SEMANTICS,
                "Name collision between %s and %s of name \"%s\".","module","submodule",
                plStack_20->mod->name);
        return LY_EVALID;
      }
    }
  }
  return buf._4_4_;
}

Assistant:

LY_ERR
parse_module(struct lysp_yang_ctx *ctx, struct lysp_module *mod)
{
    LY_ERR ret = 0;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw, prev_kw = 0;
    enum yang_module_stmt mod_stmt = Y_MOD_MODULE_HEADER;
    const struct lysp_submodule *dup;

    mod->is_submod = 0;

    /* module name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, mod->mod->name, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {

#define CHECK_ORDER(SECTION) \
        if (mod_stmt > SECTION) {\
            LOGVAL_PARSER(ctx, LY_VCODE_INORD, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(prev_kw)); return LY_EVALID;\
        } mod_stmt = SECTION

        switch (kw) {
        /* module header */
        case LY_STMT_NAMESPACE:
        case LY_STMT_PREFIX:
            CHECK_ORDER(Y_MOD_MODULE_HEADER);
            break;
        case LY_STMT_YANG_VERSION:
            CHECK_ORDER(Y_MOD_MODULE_HEADER);
            break;
        /* linkage */
        case LY_STMT_INCLUDE:
        case LY_STMT_IMPORT:
            CHECK_ORDER(Y_MOD_LINKAGE);
            break;
        /* meta */
        case LY_STMT_ORGANIZATION:
        case LY_STMT_CONTACT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_REFERENCE:
            CHECK_ORDER(Y_MOD_META);
            break;

        /* revision */
        case LY_STMT_REVISION:
            CHECK_ORDER(Y_MOD_REVISION);
            break;
        /* body */
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_AUGMENT:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_DEVIATION:
        case LY_STMT_EXTENSION:
        case LY_STMT_FEATURE:
        case LY_STMT_GROUPING:
        case LY_STMT_IDENTITY:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST:
        case LY_STMT_NOTIFICATION:
        case LY_STMT_RPC:
        case LY_STMT_TYPEDEF:
        case LY_STMT_USES:
            mod_stmt = Y_MOD_BODY;
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            /* no place in the statement order defined */
            break;
        default:
            /* error handled in the next switch */
            break;
        }
#undef CHECK_ORDER

        prev_kw = kw;
        switch (kw) {
        /* module header */
        case LY_STMT_YANG_VERSION:
            LY_CHECK_RET(parse_yangversion(ctx, mod));
            break;
        case LY_STMT_NAMESPACE:
            LY_CHECK_RET(parse_text_field(ctx, mod, LY_STMT_NAMESPACE, 0, &mod->mod->ns, Y_STR_ARG, NULL, &mod->exts));
            break;
        case LY_STMT_PREFIX:
            LY_CHECK_RET(parse_text_field(ctx, mod->mod->prefix, LY_STMT_PREFIX, 0, &mod->mod->prefix, Y_IDENTIF_ARG,
                    NULL, &mod->exts));
            break;

        /* linkage */
        case LY_STMT_INCLUDE:
            LY_CHECK_RET(parse_include(ctx, mod->mod->name, &mod->includes));
            break;
        case LY_STMT_IMPORT:
            LY_CHECK_RET(parse_import(ctx, mod->mod->prefix, &mod->imports));
            break;

        /* meta */
        case LY_STMT_ORGANIZATION:
            LY_CHECK_RET(parse_text_field(ctx, mod, LY_STMT_ORGANIZATION, 0, &mod->mod->org, Y_STR_ARG, NULL, &mod->exts));
            break;
        case LY_STMT_CONTACT:
            LY_CHECK_RET(parse_text_field(ctx, mod, LY_STMT_CONTACT, 0, &mod->mod->contact, Y_STR_ARG, NULL, &mod->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, mod->mod->dsc, LY_STMT_DESCRIPTION, 0, &mod->mod->dsc, Y_STR_ARG, NULL,
                    &mod->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, mod->mod->ref, LY_STMT_REFERENCE, 0, &mod->mod->ref, Y_STR_ARG, NULL,
                    &mod->exts));
            break;

        /* revision */
        case LY_STMT_REVISION:
            LY_CHECK_RET(parse_revision(ctx, &mod->revs));
            break;

        /* body */
        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "module");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, NULL, &mod->data));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, NULL, &mod->data));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, NULL, &mod->data));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, NULL, &mod->data));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, NULL, &mod->data));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, NULL, &mod->data));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, NULL, &mod->data));
            break;

        case LY_STMT_AUGMENT:
            LY_CHECK_RET(parse_augment(ctx, NULL, &mod->augments));
            break;
        case LY_STMT_DEVIATION:
            LY_CHECK_RET(parse_deviation(ctx, &mod->deviations));
            break;
        case LY_STMT_EXTENSION:
            LY_CHECK_RET(parse_extension(ctx, &mod->extensions));
            break;
        case LY_STMT_FEATURE:
            LY_CHECK_RET(parse_feature(ctx, &mod->features));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, NULL, &mod->groupings));
            break;
        case LY_STMT_IDENTITY:
            LY_CHECK_RET(parse_identity(ctx, &mod->identities));
            break;
        case LY_STMT_NOTIFICATION:
            LY_CHECK_RET(parse_notif(ctx, NULL, &mod->notifs));
            break;
        case LY_STMT_RPC:
            LY_CHECK_RET(parse_action(ctx, NULL, &mod->rpcs));
            break;
        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, NULL, &mod->typedefs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, mod, LY_STMT_MODULE, 0, &mod->exts));
            break;

        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "module");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, mod->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!mod->mod->ns) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "namespace", "module");
        return LY_EVALID;
    } else if (!mod->mod->prefix) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "prefix", "module");
        return LY_EVALID;
    }

    /* submodules share the namespace with the module names, so there must not be
     * a submodule of the same name in the context, no need for revision matching */
    dup = ly_ctx_get_submodule_latest(PARSER_CTX(ctx), mod->mod->name);
    if (dup) {
        LOGVAL_PARSER(ctx, LY_VCODE_NAME2_COL, "module", "submodule", mod->mod->name);
        return LY_EVALID;
    }

cleanup:
    return ret;
}